

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::append<std::move_iterator<unsigned_char*>,void>
          (SmallVectorImpl<unsigned_char> *this,move_iterator<unsigned_char_*> in_start,
          move_iterator<unsigned_char_*> in_end)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (long)in_end._M_current - (long)in_start._M_current;
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                 super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<unsigned_char,_true>).
      super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity - uVar1 <
      uVar2) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,uVar1 + uVar2,1);
  }
  if (in_end._M_current != in_start._M_current) {
    memmove((void *)((ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                            super_SmallVectorTemplateCommon<unsigned_char,_void>.
                            super_SmallVectorBase.Size +
                    (long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                          super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase
                          .BeginX),in_start._M_current,uVar2);
  }
  uVar2 = uVar2 + (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if (uVar2 <= (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity)
  {
    (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = (uint)uVar2;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }